

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.hpp
# Opt level: O3

void __thiscall
ear::CartesianSpeakerPosition::~CartesianSpeakerPosition(CartesianSpeakerPosition *this)

{
  type tVar1;
  type tVar2;
  
  if ((this->screenEdgeLock).vertical.super_type.m_initialized == true) {
    tVar2 = (this->screenEdgeLock).vertical.super_type.m_storage.dummy_.aligner_;
    tVar1 = (type)((long)&(this->screenEdgeLock).vertical.super_type.m_storage.dummy_ + 0x10);
    if (tVar2 != tVar1) {
      operator_delete((void *)tVar2,*(long *)tVar1 + 1);
    }
    (this->screenEdgeLock).vertical.super_type.m_initialized = false;
  }
  if ((this->screenEdgeLock).horizontal.super_type.m_initialized == true) {
    tVar2 = (this->screenEdgeLock).horizontal.super_type.m_storage.dummy_.aligner_;
    tVar1 = (type)((long)&(this->screenEdgeLock).horizontal.super_type.m_storage.dummy_ + 0x10);
    if (tVar2 != tVar1) {
      operator_delete((void *)tVar2,*(long *)tVar1 + 1);
    }
    (this->screenEdgeLock).horizontal.super_type.m_initialized = false;
  }
  return;
}

Assistant:

struct EAR_EXPORT CartesianSpeakerPosition {
    CartesianSpeakerPosition(double X = 0.0, double Y = 1.0, double Z = 0.0)
        : X(X), Y(Y), Z(Z){};
    double X;
    boost::optional<double> XMin;
    boost::optional<double> XMax;
    double Y;
    boost::optional<double> YMin;
    boost::optional<double> YMax;
    double Z;
    boost::optional<double> ZMin;
    boost::optional<double> ZMax;
    ScreenEdgeLock screenEdgeLock;
  }